

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.hpp
# Opt level: O2

void __thiscall
duckdb::CompressedStringScanState::~CompressedStringScanState(CompressedStringScanState *this)

{
  ~CompressedStringScanState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit CompressedStringScanState(BufferHandle &&handle_p)
	    : StringScanState(), owned_handle(std::move(handle_p)), handle(owned_handle) {
	}